

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

void sdf_contour_done(FT_Memory memory,SDF_Contour **contour)

{
  SDF_Edge_ *pSVar1;
  SDF_Contour *P;
  SDF_Edge *P_00;
  
  if ((contour != (SDF_Contour **)0x0 && memory != (FT_Memory)0x0) &&
     (P = *contour, P != (SDF_Contour *)0x0)) {
    P_00 = P->edges;
    if (P->edges != (SDF_Edge *)0x0) {
      do {
        pSVar1 = P_00->next;
        ft_mem_free(memory,P_00);
        P_00 = pSVar1;
      } while (pSVar1 != (SDF_Edge_ *)0x0);
      P = *contour;
    }
    ft_mem_free(memory,P);
    *contour = (SDF_Contour *)0x0;
  }
  return;
}

Assistant:

static void
  sdf_contour_done( FT_Memory      memory,
                    SDF_Contour**  contour )
  {
    SDF_Edge*  edges;
    SDF_Edge*  temp;


    if ( !memory || !contour || !*contour )
      return;

    edges = (*contour)->edges;

    /* release all edges */
    while ( edges )
    {
      temp  = edges;
      edges = edges->next;

      sdf_edge_done( memory, &temp );
    }

    FT_FREE( *contour );
  }